

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

type_info * pybind11::detail::get_type_info(PyTypeObject *type)

{
  bool bVar1;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *this;
  size_type sVar2;
  const_reference pptVar3;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *in_RDI;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *bases;
  PyTypeObject *in_stack_00000010;
  undefined8 local_8;
  
  this = all_type_info(in_stack_00000010);
  bVar1 = std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ::empty(bases);
  if (bVar1) {
    local_8 = (value_type)0x0;
  }
  else {
    sVar2 = std::
            vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
            size(this);
    if (1 < sVar2) {
      pybind11_fail((char *)bases);
    }
    pptVar3 = std::
              vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              ::front(in_RDI);
    local_8 = *pptVar3;
  }
  return local_8;
}

Assistant:

PYBIND11_NOINLINE detail::type_info *get_type_info(PyTypeObject *type) {
    const auto &bases = all_type_info(type);
    if (bases.empty()) {
        return nullptr;
    }
    if (bases.size() > 1) {
        pybind11_fail(
            "pybind11::detail::get_type_info: type has multiple pybind11-registered bases");
    }
    return bases.front();
}